

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FieldDescriptor::CopyTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  ArenaStringPtr *this_00;
  byte *pbVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  string *psVar6;
  once_flag *__once;
  long lVar7;
  long lVar8;
  FieldOptions *pFVar9;
  FieldOptions *pFVar10;
  Arena *pAVar11;
  FieldDescriptor *pFVar12;
  undefined1 local_50 [32];
  FieldDescriptor *local_30;
  
  psVar5 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  pAVar11 = (Arena *)(proto->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     .ptr_;
  if (((ulong)pAVar11 & 1) != 0) {
    pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
  }
  psVar6 = (proto->name_).ptr_;
  if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance(&proto->name_,pAVar11,psVar5);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar6);
  }
  iVar2 = *(int32 *)(this + 0x44);
  uVar3 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar3 | 0x40;
  proto->number_ = iVar2;
  if (this[0x41] == (FieldDescriptor)0x1) {
    psVar5 = *(string **)(this + 0x20);
    (proto->_has_bits_).has_bits_[0] = uVar3 | 0x50;
    pAVar11 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
    }
    psVar6 = (proto->json_name_).ptr_;
    if (psVar6 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->json_name_,pAVar11,psVar5);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar6);
    }
  }
  iVar4 = *(int *)(this + 0x3c);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x100;
  proto->label_ = iVar4;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_50._0_8_ = TypeOnceInit;
    local_30 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,&local_30);
  }
  iVar4 = *(int *)(this + 0x38);
  uVar3 = (proto->_has_bits_).has_bits_[0];
  (proto->_has_bits_).has_bits_[0] = uVar3 | 0x200;
  proto->type_ = iVar4;
  if (this[0x42] == (FieldDescriptor)0x1) {
    if (*(char *)(*(long *)(this + 0x50) + 0x89) == '\0') {
      (proto->_has_bits_).has_bits_[0] = uVar3 | 0x202;
      local_50._0_8_ = (FieldDescriptor *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
      pAVar11 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (proto->extendee_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->extendee_,pAVar11,(string *)local_50);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
      if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    this_00 = &proto->extendee_;
    pAVar11 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
    }
    if (this_00->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (this_00,pAVar11,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::_M_append((char *)this_00->ptr_,**(ulong **)(*(long *)(this + 0x50) + 8));
  }
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_50._0_8_ = TypeOnceInit;
    local_30 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),(_func_void_FieldDescriptor_ptr **)local_50,&local_30);
  }
  __once = *(once_flag **)(this + 0x30);
  if ((*(uint *)(this + 0x38) & 0xfffffffe) == 10) {
    if (__once != (once_flag *)0x0) {
      local_50._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,TypeOnceInit,(FieldDescriptor **)local_50);
    }
    if (*(char *)(*(long *)(this + 0x68) + 0x88) == '\x01') {
      proto->type_ = 1;
      pbVar1 = (byte *)((long)(proto->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 & 0xfd;
    }
    pFVar12 = this + 0x68;
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_50._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_50);
    }
    if (*(char *)(*(long *)pFVar12 + 0x89) == '\0') {
      *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
      local_50._0_8_ = (FieldDescriptor *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
      pAVar11 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (proto->type_name_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->type_name_,pAVar11,(string *)local_50);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
      if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    pAVar11 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
    }
    if ((proto->type_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (&proto->type_name_,pAVar11,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
  }
  else {
    if (__once != (once_flag *)0x0) {
      local_50._0_8_ = TypeOnceInit;
      local_30 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)local_50,&local_30);
    }
    if (*(int *)(this + 0x38) != 0xe) goto LAB_002c11a5;
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_50._0_8_ = this;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_50);
    }
    if (*(char *)(*(long *)(this + 0x70) + 0x29) == '\0') {
      *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
      local_50._0_8_ = (FieldDescriptor *)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,".","");
      pAVar11 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      psVar5 = (proto->type_name_).ptr_;
      if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&proto->type_name_,pAVar11,(string *)local_50);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar5);
      }
      if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    pAVar11 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
    }
    if ((proto->type_name_).ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (&proto->type_name_,pAVar11,
                 (string *)&internal::fixed_address_empty_string_abi_cxx11_);
    }
    pFVar12 = this + 0x70;
  }
  psVar5 = (proto->type_name_).ptr_;
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_50._0_8_ = this;
    std::
    call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),TypeOnceInit,(FieldDescriptor **)local_50);
  }
  std::__cxx11::string::_M_append((char *)psVar5,**(ulong **)(*(long *)pFVar12 + 8));
LAB_002c11a5:
  if (this[0x40] == (FieldDescriptor)0x1) {
    DefaultValueAsString_abi_cxx11_((string *)local_50,this,false);
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    pAVar11 = (Arena *)(proto->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
    if (((ulong)pAVar11 & 1) != 0) {
      pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
    }
    psVar5 = (proto->default_value_).ptr_;
    if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance(&proto->default_value_,pAVar11,(string *)local_50);
    }
    else {
      std::__cxx11::string::_M_assign((string *)psVar5);
    }
    if ((FieldDescriptor *)local_50._0_8_ != (FieldDescriptor *)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
  lVar7 = *(long *)(this + 0x58);
  if ((lVar7 != 0) && (this[0x42] == (FieldDescriptor)0x0)) {
    lVar8 = *(long *)(*(long *)(lVar7 + 0x10) + 0x30);
    (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 0x80;
    proto->oneof_index_ = (int)((ulong)(lVar7 - lVar8) >> 4) * -0x55555555;
  }
  pFVar10 = *(FieldOptions **)(this + 0x78);
  pFVar9 = FieldOptions::default_instance();
  if (pFVar10 != pFVar9) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    if (proto->options_ == (FieldOptions *)0x0) {
      pAVar11 = (Arena *)(proto->_internal_metadata_).
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         .ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)(((ulong)pAVar11 & 0xfffffffffffffffe) + 0x18);
      }
      pFVar10 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(pAVar11);
      proto->options_ = pFVar10;
    }
    FieldOptions::CopyFrom(proto->options_,*(FieldOptions **)(this + 0x78));
  }
  return;
}

Assistant:

void FieldDescriptor::CopyTo(FieldDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());
  if (has_json_name_) {
    proto->set_json_name(json_name());
  }

  // Some compilers do not allow static_cast directly between two enum types,
  // so we must cast to int first.
  proto->set_label(static_cast<FieldDescriptorProto::Label>(
      implicit_cast<int>(label())));
  proto->set_type(static_cast<FieldDescriptorProto::Type>(
      implicit_cast<int>(type())));

  if (is_extension()) {
    if (!containing_type()->is_unqualified_placeholder_) {
      proto->set_extendee(".");
    }
    proto->mutable_extendee()->append(containing_type()->full_name());
  }

  if (cpp_type() == CPPTYPE_MESSAGE) {
    if (message_type()->is_placeholder_) {
      // We don't actually know if the type is a message type.  It could be
      // an enum.
      proto->clear_type();
    }

    if (!message_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(message_type()->full_name());
  } else if (cpp_type() == CPPTYPE_ENUM) {
    if (!enum_type()->is_unqualified_placeholder_) {
      proto->set_type_name(".");
    }
    proto->mutable_type_name()->append(enum_type()->full_name());
  }

  if (has_default_value()) {
    proto->set_default_value(DefaultValueAsString(false));
  }

  if (containing_oneof() != nullptr && !is_extension()) {
    proto->set_oneof_index(containing_oneof()->index());
  }

  if (&options() != &FieldOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}